

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O0

bool __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::isValid(ThreeAxisForceTorqueContactSensor *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffa8;
  string local_30 [47];
  bool local_1;
  
  (**(code **)(*(long *)in_RDI + 0x10))();
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_30);
  if (bVar1) {
    local_1 = false;
  }
  else if (*(long *)(in_RDI->_M_string_length + 0x80) < 0) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ThreeAxisForceTorqueContactSensor::isValid() const
{
    if( this->getName() == "" )
    {
        return false;
    }

    if( this->pimpl->parent_link_index < 0 )
    {
        // Return false because the links is not appropriately setted
        return false;
    }

    return true;
}